

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O0

void __thiscall
Lodtalk::StackInterpreter::activateBlockClosure(StackInterpreter *this,BlockClosure *closure)

{
  StackMemory *this_00;
  SmallIntegerValue SVar1;
  Context *pCVar2;
  uint8_t *puVar3;
  uintptr_t value;
  size_t sVar4;
  ulong local_60;
  size_t i;
  size_t copiedElements;
  anon_union_8_4_0eb573b0_for_Oop_0 local_48;
  anon_union_8_4_0eb573b0_for_Oop_0 local_40;
  anon_union_8_4_0eb573b0_for_Oop_0 local_38;
  Oop receiver;
  CompiledMethod *newMethod;
  Context *outerContext;
  int numArguments;
  BlockClosure *closure_local;
  StackInterpreter *this_local;
  
  SVar1 = Oop::decodeSmallInteger(&closure->numArgs);
  pCVar2 = BlockClosure::getOuterContext(closure);
  receiver.field_0 = (anon_union_8_4_0eb573b0_for_Oop_0)pCVar2->method;
  local_38 = (pCVar2->receiver).field_0;
  puVar3 = StackMemory::getFramePointer(this->stack);
  pushPointer(this,puVar3);
  this_00 = this->stack;
  puVar3 = StackMemory::getStackPointer(this->stack);
  StackMemory::setFramePointer(this_00,puVar3);
  local_40.pointer = (uint8_t *)Oop::fromPointer(receiver.field_0);
  pushOop(this,(Oop)local_40);
  this->method = (CompiledMethod *)receiver.field_0;
  value = encodeFrameMetaData(false,true,(long)(int)SVar1);
  pushUInt(this,value);
  Oop::Oop((Oop *)&local_48);
  pushOop(this,(Oop)local_48);
  pushOop(this,(Oop)local_38);
  sVar4 = ProtoObject::getNumberOfElements((ProtoObject *)closure);
  for (local_60 = 0; local_60 < sVar4 - 3; local_60 = local_60 + 1) {
    pushOop(this,(Oop)*(anon_union_8_4_0eb573b0_for_Oop_0 *)(&closure[1].super_Object + local_60));
  }
  garbageCollectionSafePoint(this);
  fetchFrameData(this);
  sVar4 = Oop::decodeSmallInteger(&closure->startpc);
  this->pc = sVar4;
  checkStackOverflow(this);
  fetchNextInstructionOpcode(this);
  return;
}

Assistant:

void StackInterpreter::activateBlockClosure(BlockClosure *closure)
{
    int numArguments = (int)closure->numArgs.decodeSmallInteger();

    // Get the receiver and the method.
    auto outerContext = closure->getOuterContext();
    auto newMethod = outerContext->method;
    auto receiver = outerContext->receiver;

    // Push the frame pointer.
	pushPointer(stack->getFramePointer()); // Return frame pointer.

	// Set the new frame pointer.
	stack->setFramePointer(stack->getStackPointer());

	// Push the method object.
	pushOop(Oop::fromPointer(newMethod));
	this->method = newMethod;

    // Encode frame metadata
	pushUInt(encodeFrameMetaData(false, true, numArguments));

	// Push the nil this context.
	pushOop(Oop());

	// Push the receiver oop.
	pushOop(receiver);

    // Copy the elements
    auto copiedElements = closure->getNumberOfElements() - 3;
    for(size_t i = 0; i < copiedElements; ++i)
        pushOop(closure->copiedData[i]);

    // Safe point for GC.
    garbageCollectionSafePoint();

    // Fetch the frame data.
	fetchFrameData();

    // Set the initial pc
    pc = closure->startpc.decodeSmallInteger();

    // Check for stack overflow.
    checkStackOverflow();

    // Fetch the first instruction opcode
	fetchNextInstructionOpcode();
}